

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  EchoProgress *this_00;
  pointer *this_01;
  cmMakefile *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGeneratorTarget *pcVar3;
  bool bVar4;
  bool forResponse;
  bool useWatcomQuote_00;
  int iVar5;
  char *pcVar6;
  cmLinkLineComputer *pcVar7;
  undefined4 extraout_var;
  cmRulePlaceholderExpander *pcVar8;
  reference pbVar9;
  char *pcVar10;
  iterator __first;
  iterator __last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  cmOutputConverter *local_9b0;
  cmOutputConverter *local_908;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7c0;
  const_iterator local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_798;
  const_iterator local_790;
  allocator local_781;
  string local_780;
  char *local_760;
  char *name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_738;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_730;
  iterator i;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string local_718;
  char *local_6f8;
  char *val;
  string launcher;
  string targetOutPathCompilePDB;
  string targetFullPathCompilePDB;
  string local_688;
  string local_668;
  undefined1 local_648 [8];
  string target;
  OutputFormat output;
  string local_600;
  string local_5e0;
  undefined1 local_5c0 [8];
  string objectDir;
  RuleVariables vars;
  string buildObjs;
  string linkLibs;
  cmStateDirectory local_460;
  auto_ptr<cmLinkLineComputer> local_438;
  auto_ptr<cmLinkLineComputer> linkLineComputer;
  undefined1 local_408 [5];
  bool useWatcomQuote;
  bool useResponseFileForLibs;
  bool useResponseFileForObjects;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string linkRule;
  undefined1 local_3c8 [8];
  string linkRuleVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  undefined1 local_388 [6];
  bool useLinkScript;
  string local_368;
  undefined1 local_348 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  allocator local_309;
  undefined1 local_308 [8];
  string linkFlagsConfig;
  string local_2e0;
  string local_2c0;
  allocator local_299;
  undefined1 local_298 [8];
  string export_flag_var;
  string linkFlags;
  string flags;
  string local_230;
  string local_210;
  string local_1f0;
  allocator local_1c9;
  undefined1 local_1c8 [8];
  string buildEcho;
  EchoProgress progress;
  undefined1 local_148 [8];
  string targetOutputReal;
  string local_120;
  undefined1 local_100 [8];
  string objExt;
  undefined1 local_d8 [8];
  string linkLanguage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  undefined1 local_59;
  LinkClosure *pLStack_58;
  bool hasCUDA;
  LinkClosure *closure;
  allocator local_39;
  undefined1 local_38 [8];
  string cuda_lang;
  bool relink_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  cuda_lang.field_2._M_local_buf[0xf] = relink;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"CUDA",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pLStack_58 = cmGeneratorTarget::GetLinkClosure
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget,
                          &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           ConfigName);
  local_70._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&pLStack_58->Languages);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pLStack_58->Languages);
  local_68 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_70,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_78,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
  local_80._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&pLStack_58->Languages);
  local_59 = __gnu_cxx::operator!=(&local_68,&local_80);
  if ((bool)local_59) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&linkLanguage.field_2 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(pvVar11);
    cmMakefileTargetGenerator::AppendLinkDepends(&this->super_cmMakefileTargetGenerator,pvVar11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d8,"CUDA",(allocator *)(objExt.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(objExt.field_2._M_local_buf + 0xf));
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_120,"CMAKE_CUDA_OUTPUT_EXTENSION",
               (allocator *)(targetOutputReal.field_2._M_local_buf + 0xf));
    pcVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_120);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_100,pcVar6,(allocator *)(targetOutputReal.field_2._M_local_buf + 0xe)
              );
    std::allocator<char>::~allocator
              ((allocator<char> *)(targetOutputReal.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator
              ((allocator<char> *)(targetOutputReal.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&progress.Arg.field_2 + 8),
                   &((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget)->ObjectDirectory,"cmake_device_link");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&progress.Arg.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    std::__cxx11::string::~string((string *)(progress.Arg.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&this->DeviceLinkObject,(string *)local_148);
    (this->super_cmMakefileTargetGenerator).NumberOfProgressActions =
         (this->super_cmMakefileTargetGenerator).NumberOfProgressActions + 1;
    if (((this->super_cmMakefileTargetGenerator).NoRuleMessages & 1U) == 0) {
      this_00 = (EchoProgress *)((long)&buildEcho.field_2 + 8);
      cmLocalUnixMakefileGenerator3::EchoProgress::EchoProgress(this_00);
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_1c8,"Linking ",&local_1c9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::__cxx11::string::operator+=((string *)local_1c8,(string *)local_d8);
      std::__cxx11::string::operator+=((string *)local_1c8," device code ");
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_230,pcVar6,(allocator *)(flags.field_2._M_local_buf + 0xf));
      cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
                (&local_210,pcVar2,&local_230,&this->DeviceLinkObject);
      cmOutputConverter::ConvertToOutputFormat
                (&local_1f0,
                 &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_210,SHELL);
      std::__cxx11::string::operator+=((string *)local_1c8,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)(flags.field_2._M_local_buf + 0xf));
      cmLocalUnixMakefileGenerator3::AppendEcho
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1c8,EchoLink
                 ,(EchoProgress *)((long)&buildEcho.field_2 + 8));
      std::__cxx11::string::~string((string *)local_1c8);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress
                ((EchoProgress *)((long)&buildEcho.field_2 + 8));
    }
    std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(export_flag_var.field_2._M_local_buf + 8));
    bVar4 = cmGeneratorTarget::IsExecutableWithExports
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_298,"CMAKE_EXE_EXPORTS_",&local_299);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      std::__cxx11::string::operator+=((string *)local_298,(string *)local_d8);
      std::__cxx11::string::operator+=((string *)local_298,"_FLAG");
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar6 = cmMakefile::GetDefinition
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,(string *)local_298);
      (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
                (pcVar2,(undefined1 *)((long)&export_flag_var.field_2 + 8),pcVar6);
      std::__cxx11::string::~string((string *)local_298);
    }
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    cmLocalGenerator::GetLinkLibsCMP0065
              (&local_2c0,(cmLocalGenerator *)pcVar2,(string *)local_d8,
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
              );
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar2,(undefined1 *)((long)&export_flag_var.field_2 + 8),&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    cmLocalGenerator::AddLanguageFlagsForLinking
              ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
               (string *)((long)&linkFlags.field_2 + 8),
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,(string *)local_d8,
               &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
               (string *)((long)&linkFlags.field_2 + 8),
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,(string *)local_d8,
               &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2e0,"LINK_FLAGS",
               (allocator *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
    pcVar6 = cmGeneratorTarget::GetProperty(pcVar3,&local_2e0);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
              (pcVar2,(undefined1 *)((long)&export_flag_var.field_2 + 8),pcVar6);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_308,"LINK_FLAGS_",&local_309);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    cmsys::SystemTools::UpperCase
              ((string *)
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    std::__cxx11::string::operator+=
              ((string *)local_308,
               (string *)
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar6 = cmGeneratorTarget::GetProperty
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget,(string *)local_308);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
              (pcVar2,(undefined1 *)((long)&export_flag_var.field_2 + 8),pcVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_348);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_388,pcVar6,
               (allocator *)
               ((long)&real_link_commands.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_368,pcVar2,(string *)local_388,(string *)local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_348,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)local_388);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&real_link_commands.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    real_link_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
         cmGlobalGenerator::GetUseLinkScript
                   ((cmGlobalGenerator *)(this->super_cmMakefileTargetGenerator).GlobalGenerator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&linkRuleVar.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_3c8,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",
               (allocator *)(linkRule.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
    cmMakefileTargetGenerator::GetLinkRule
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &this->super_cmMakefileTargetGenerator,(string *)local_3c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_408);
    cmSystemTools::ExpandListArgument
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkRuleVar.field_2 + 8),false);
    bVar4 = cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                      (&this->super_cmMakefileTargetGenerator,(string *)local_d8);
    forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                            (&this->super_cmMakefileTargetGenerator,(string *)local_d8);
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &linkLineComputer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                   "_USE_WATCOM_QUOTE");
    useWatcomQuote_00 = cmMakefile::IsOn(pcVar1,(string *)&linkLineComputer);
    std::__cxx11::string::~string((string *)&linkLineComputer);
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               (bool)(real_link_commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
    pcVar7 = (cmLinkLineComputer *)operator_new(0x40);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    local_908 = (cmOutputConverter *)0x0;
    if (pcVar2 != (cmLocalUnixMakefileGenerator3 *)0x0) {
      local_908 = &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
    }
    cmLocalGenerator::GetStateSnapshot
              ((cmStateSnapshot *)((long)&linkLibs.field_2 + 8),
               (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
    cmStateSnapshot::GetDirectory(&local_460,(cmStateSnapshot *)((long)&linkLibs.field_2 + 8));
    cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
              ((cmLinkLineDeviceComputer *)pcVar7,local_908,&local_460);
    ::cm::auto_ptr<cmLinkLineComputer>::auto_ptr(&local_438,pcVar7);
    pcVar7 = ::cm::auto_ptr<cmLinkLineComputer>::operator->(&local_438);
    cmLinkLineComputer::SetForResponse(pcVar7,forResponse);
    pcVar7 = ::cm::auto_ptr<cmLinkLineComputer>::operator->(&local_438);
    cmLinkLineComputer::SetUseWatcomQuote(pcVar7,useWatcomQuote_00);
    pcVar7 = ::cm::auto_ptr<cmLinkLineComputer>::operator->(&local_438);
    cmLinkLineComputer::SetRelink(pcVar7,(bool)(cuda_lang.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::string((string *)(buildObjs.field_2._M_local_buf + 8));
    pcVar7 = ::cm::auto_ptr<cmLinkLineComputer>::get(&local_438);
    cmMakefileTargetGenerator::CreateLinkLibs
              (&this->super_cmMakefileTargetGenerator,pcVar7,
               (string *)(buildObjs.field_2._M_local_buf + 8),forResponse,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkLanguage.field_2 + 8));
    std::__cxx11::string::string((string *)&vars.FilterPrefix);
    cmMakefileTargetGenerator::CreateObjectLists
              (&this->super_cmMakefileTargetGenerator,
               (bool)(real_link_commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1),false,bVar4,
               (string *)&vars.FilterPrefix,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkLanguage.field_2 + 8),useWatcomQuote_00);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&objectDir.field_2 + 8));
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
              ((string *)local_5c0,
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
              );
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&output,pcVar6,(allocator *)(target.field_2._M_local_buf + 0xf));
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_600,pcVar2,(string *)&output,(string *)local_5c0);
    cmOutputConverter::ConvertToOutputFormat
              (&local_5e0,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_600,SHELL);
    std::__cxx11::string::operator=((string *)local_5c0,(string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&output);
    std::allocator<char>::~allocator((allocator<char> *)(target.field_2._M_local_buf + 0xf));
    target.field_2._8_4_ = ZEXT14(useWatcomQuote_00);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_688,pcVar6,
               (allocator *)(targetFullPathCompilePDB.field_2._M_local_buf + 0xf));
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_668,pcVar2,&local_688,(string *)local_148);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_648,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_668,target.field_2._8_4_);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator
              ((allocator<char> *)(targetFullPathCompilePDB.field_2._M_local_buf + 0xf));
    cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
              ((string *)((long)&targetOutPathCompilePDB.field_2 + 8),
               (cmCommonTargetGenerator *)this);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)((long)&launcher.field_2 + 8),
               &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               (string *)((long)&targetOutPathCompilePDB.field_2 + 8),SHELL);
    vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
    vars.Language = (char *)std::__cxx11::string::c_str();
    vars.Object = (char *)std::__cxx11::string::c_str();
    vars.Objects = (char *)std::__cxx11::string::c_str();
    vars.Target = (char *)std::__cxx11::string::c_str();
    vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
    vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
    vars.TargetPDB = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)&val);
    pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_718,"RULE_LAUNCH_LINK",
               (allocator *)((long)&rulePlaceholderExpander.x_ + 7));
    pcVar6 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar2,pcVar3,&local_718);
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rulePlaceholderExpander.x_ + 7));
    local_6f8 = pcVar6;
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      std::__cxx11::string::operator=((string *)&val,pcVar6);
      std::__cxx11::string::operator+=((string *)&val," ");
    }
    iVar5 = (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    ::cm::auto_ptr<cmRulePlaceholderExpander>::auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)&i,
               (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar5));
    pcVar8 = ::cm::auto_ptr<cmRulePlaceholderExpander>::operator->
                       ((auto_ptr<cmRulePlaceholderExpander> *)&i);
    cmRulePlaceholderExpander::SetTargetImpLib(pcVar8,(string *)local_148);
    local_730._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkRuleVar.field_2 + 8));
    while( true ) {
      local_738._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkRuleVar.field_2 + 8));
      bVar4 = __gnu_cxx::operator!=(&local_730,&local_738);
      if (!bVar4) break;
      pbVar9 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_730);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     pbVar9);
      pbVar9 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_730);
      std::__cxx11::string::operator=((string *)pbVar9,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      pcVar8 = ::cm::auto_ptr<cmRulePlaceholderExpander>::operator->
                         ((auto_ptr<cmRulePlaceholderExpander> *)&i);
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      local_9b0 = (cmOutputConverter *)0x0;
      if (pcVar2 != (cmLocalUnixMakefileGenerator3 *)0x0) {
        local_9b0 = &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      pbVar9 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_730);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (pcVar8,local_9b0,pbVar9,(RuleVariables *)((long)&objectDir.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_730);
    }
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false);
    ::cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr((auto_ptr<cmRulePlaceholderExpander> *)&i);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetOutPathCompilePDB.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_648);
    std::__cxx11::string::~string((string *)local_5c0);
    std::__cxx11::string::~string((string *)&vars.FilterPrefix);
    std::__cxx11::string::~string((string *)(buildObjs.field_2._M_local_buf + 8));
    ::cm::auto_ptr<cmLinkLineComputer>::~auto_ptr(&local_438);
    if ((real_link_commands.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_408,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&linkRuleVar.field_2 + 8));
    }
    else {
      local_760 = "dlink.txt";
      if ((cuda_lang.field_2._M_local_buf[0xf] & 1U) != 0) {
        local_760 = "drelink.txt";
      }
      cmMakefileTargetGenerator::CreateLinkScript
                (&this->super_cmMakefileTargetGenerator,local_760,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkRuleVar.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_408,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkLanguage.field_2 + 8));
    }
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar6 = cmMakefile::GetCurrentBinaryDirectory
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        Makefile);
    pcVar10 = cmLocalGenerator::GetBinaryDirectory
                        ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_780,pcVar10,&local_781);
    cmLocalUnixMakefileGenerator3::CreateCDCommand
              (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_408,pcVar6,&local_780);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    this_01 = &depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_798._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_01);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_790,&local_798);
    local_7a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_408);
    local_7a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_408);
    local_7b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           this_01,local_790,local_7a0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_7a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_408);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((this->super_cmMakefileTargetGenerator).LocalGenerator,
               (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
               (string *)local_148,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkLanguage.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,false,false);
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,(string *)local_148,
               (bool)(cuda_lang.field_2._M_local_buf[0xf] & 1));
    pvVar11 = &(this->super_cmMakefileTargetGenerator).CleanFiles;
    local_7c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar11);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_7b8,&local_7c0);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_348);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_348);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar11,
               local_7b8,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_408);
    std::__cxx11::string::~string
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_3c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&linkRuleVar.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348);
    std::__cxx11::string::~string((string *)local_308);
    std::__cxx11::string::~string((string *)(export_flag_var.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&linkLanguage.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    this->GeneratorTarget->GetLinkClosure(this->ConfigName);

  const bool hasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());
  if (!hasCUDA) {
    return;
  }

  std::vector<std::string> commands;

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends);

  // Get the language to use for linking this library.
  std::string linkLanguage = "CUDA";
  std::string const objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  // Get the name of the device object to generate.
  std::string const targetOutputReal =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutputReal;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking ";
    buildEcho += linkLanguage;
    buildEcho += " device code ";
    buildEcho += this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(),
        this->DeviceLinkObject),
      cmOutputConverter::SHELL);
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  // Build a list of compiler flags and linker flags.
  std::string flags;
  std::string linkFlags;

  // Add flags to create an executable.
  // Add symbol export flags if necessary.
  if (this->GeneratorTarget->IsExecutableWithExports()) {
    std::string export_flag_var = "CMAKE_EXE_EXPORTS_";
    export_flag_var += linkLanguage;
    export_flag_var += "_FLAG";
    this->LocalGenerator->AppendFlags(
      linkFlags, this->Makefile->GetDefinition(export_flag_var));
  }

  this->LocalGenerator->AppendFlags(linkFlags,
                                    this->LocalGenerator->GetLinkLibsCMP0065(
                                      linkLanguage, *this->GeneratorTarget));

  // Add language feature flags.
  this->LocalGenerator->AddLanguageFlagsForLinking(
    flags, this->GeneratorTarget, linkLanguage, this->ConfigName);

  this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                             linkLanguage, this->ConfigName);

  // Add target-specific linker flags.
  this->LocalGenerator->AppendFlags(
    linkFlags, this->GeneratorTarget->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags(
    linkFlags, this->GeneratorTarget->GetProperty(linkFlagsConfig));

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(this->LocalGenerator->MaybeConvertToRelativePath(
    this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmSystemTools::ExpandListArgument(linkRule, real_link_commands);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    bool useWatcomQuote =
      this->Makefile->IsOn(linkRuleVar + "_USE_WATCOM_QUOTE");

    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    CM_AUTO_PTR<cmLinkLineComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetUseWatcomQuote(useWatcomQuote);
    linkLineComputer->SetRelink(relink);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(linkLineComputer.get(), linkLibs,
                         useResponseFileForLibs, depends);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(useLinkScript, false, useResponseFileForObjects,
                            buildObjs, depends, useWatcomQuote);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), objectDir),
      cmOutputConverter::SHELL);

    cmOutputConverter::OutputFormat output = (useWatcomQuote)
      ? cmOutputConverter::WATCOMQUOTE
      : cmOutputConverter::SHELL;
    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal),
      output);

    std::string targetFullPathCompilePDB = this->ComputeTargetCompilePDB();
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.Flags = flags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    const char* val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->LocalGenerator->CreateRulePlaceholderExpander());

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutputReal);
    for (std::vector<std::string>::iterator i = real_link_commands.begin();
         i != real_link_commands.end(); ++i) {
      *i = launcher + *i;
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator, *i,
                                                   vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  commands.insert(commands.end(), commands1.begin(), commands1.end());
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, CM_NULLPTR,
                                      targetOutputReal, depends, commands,
                                      false);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutputReal, relink);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(this->CleanFiles.end(), exeCleanFiles.begin(),
                          exeCleanFiles.end());
#else
  static_cast<void>(relink);
#endif
}